

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O0

SmartPtr<AsyncEventAgent> * __thiscall
SmartPtr<AsyncEventAgent>::operator=(SmartPtr<AsyncEventAgent> *this,AsyncEventAgent *obj)

{
  AsyncEventAgent *obj_local;
  SmartPtr<AsyncEventAgent> *this_local;
  
  if (obj != (AsyncEventAgent *)0x0) {
    RefCount::AddRef((RefCount *)obj);
  }
  if (this->mObj != (AsyncEventAgent *)0x0) {
    RefCount::Release((RefCount *)this->mObj);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}